

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

boolean save_marker(j_decompress_ptr cinfo)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  jpeg_marker_reader *pjVar4;
  jpeg_source_mgr *pjVar5;
  jpeg_error_mgr *pjVar6;
  jpeg_saved_marker_ptr_conflict pjVar7;
  boolean bVar8;
  jpeg_marker_parser_method *pp_Var9;
  jpeg_saved_marker_ptr_conflict pjVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  jpeg_saved_marker_ptr data;
  byte *pbVar15;
  byte *pbVar16;
  uint datalen;
  ulong uVar17;
  bool bVar18;
  jpeg_saved_marker_ptr local_48;
  ulong local_38;
  
  pjVar4 = cinfo->marker;
  local_48 = (jpeg_saved_marker_ptr)pjVar4[6].read_markers;
  pjVar5 = cinfo->src;
  pbVar16 = pjVar5->next_input_byte;
  sVar14 = pjVar5->bytes_in_buffer;
  if (local_48 == (jpeg_saved_marker_ptr)0x0) {
    if (sVar14 == 0) {
      bVar8 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar8 == 0) {
        return 0;
      }
      pbVar16 = pjVar5->next_input_byte;
      sVar14 = pjVar5->bytes_in_buffer;
    }
    bVar2 = *pbVar16;
    sVar14 = sVar14 - 1;
    if (sVar14 == 0) {
      bVar8 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar8 == 0) {
        return 0;
      }
      pbVar15 = pjVar5->next_input_byte;
      sVar14 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar15 = pbVar16 + 1;
    }
    sVar14 = sVar14 - 1;
    pbVar16 = pbVar15 + 1;
    local_38 = ((ulong)bVar2 * 0x100 + (ulong)*pbVar15) - 2;
    uVar12 = 0;
    if (((ulong)bVar2 * 0x100 | (ulong)*pbVar15) < 2) {
      local_48 = (jpeg_saved_marker_ptr)0x0;
      uVar17 = 0;
      data = (jpeg_saved_marker_ptr)0x0;
    }
    else {
      pp_Var9 = (jpeg_marker_parser_method *)
                ((long)pjVar4 + (long)cinfo->unread_marker * 4 + -0x2cc);
      if ((long)cinfo->unread_marker == 0xfe) {
        pp_Var9 = &pjVar4[4].read_restart_marker;
      }
      uVar17 = (ulong)*(uint *)pp_Var9;
      if ((uint)local_38 <= *(uint *)pp_Var9) {
        uVar17 = local_38 & 0xffffffff;
      }
      local_48 = (jpeg_saved_marker_ptr)
                 (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,uVar17 + 0x20);
      local_48->next = (jpeg_saved_marker_ptr)0x0;
      local_48->marker = (UINT8)*(code *)&cinfo->unread_marker;
      local_48->original_length = (uint)local_38;
      local_48->data_length = (uint)uVar17;
      data = local_48 + 1;
      local_48->data = (JOCTET *)data;
      pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)local_48;
      *(undefined4 *)&pjVar4[6].read_restart_marker = 0;
      uVar12 = 0;
    }
  }
  else {
    uVar17 = (ulong)local_48->data_length;
    data = (jpeg_saved_marker_ptr)(local_48->data + *(uint *)&pjVar4[6].read_restart_marker);
    local_38 = 0;
    uVar12 = (ulong)*(uint *)&pjVar4[6].read_restart_marker;
  }
  do {
    do {
      uVar11 = (uint)uVar12;
      datalen = (uint)uVar17;
      if (datalen <= uVar11) {
        if (local_48 != (jpeg_saved_marker_ptr)0x0) {
          pjVar7 = cinfo->marker_list;
          if (cinfo->marker_list == (jpeg_saved_marker_ptr_conflict)0x0) {
            pjVar10 = (jpeg_saved_marker_ptr_conflict)&cinfo->marker_list;
          }
          else {
            do {
              pjVar10 = pjVar7;
              pjVar7 = pjVar10->next;
            } while (pjVar10->next != (jpeg_saved_marker_ptr)0x0);
          }
          pjVar10->next = local_48;
          data = (jpeg_saved_marker_ptr)local_48->data;
          local_38 = (ulong)(local_48->original_length - datalen);
        }
        pjVar4[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
        iVar3 = cinfo->unread_marker;
        if (iVar3 == 0xee) {
          examine_app14(cinfo,(JOCTET *)data,datalen,local_38);
        }
        else if (iVar3 == 0xe0) {
          examine_app0(cinfo,(JOCTET *)data,datalen,local_38);
        }
        else {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x5b;
          (pjVar6->msg_parm).i[0] = iVar3;
          (cinfo->err->msg_parm).i[1] = datalen + (int)local_38;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        }
        pjVar5->next_input_byte = pbVar16;
        pjVar5->bytes_in_buffer = sVar14;
        if (0 < (long)local_38) {
          (*cinfo->src->skip_input_data)(cinfo,local_38);
        }
        return 1;
      }
      pjVar5->next_input_byte = pbVar16;
      pjVar5->bytes_in_buffer = sVar14;
      *(uint *)&pjVar4[6].read_restart_marker = uVar11;
      if (sVar14 == 0) {
        bVar8 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar8 == 0) {
          return 0;
        }
        pbVar16 = pjVar5->next_input_byte;
        sVar14 = pjVar5->bytes_in_buffer;
      }
    } while ((datalen <= uVar11) || (sVar14 == 0));
    lVar13 = 0;
    do {
      *(byte *)((long)&data->next + lVar13) = pbVar16[lVar13];
      lVar1 = lVar13 + 1;
      if (datalen <= uVar11 + (int)lVar13 + 1) break;
      bVar18 = sVar14 - 1 != lVar13;
      lVar13 = lVar1;
    } while (bVar18);
    sVar14 = sVar14 - lVar1;
    pbVar16 = pbVar16 + lVar1;
    data = (jpeg_saved_marker_ptr)((long)&data->next + lVar1);
    uVar12 = (ulong)(uVar11 + (int)lVar1);
  } while( true );
}

Assistant:

METHODDEF(boolean)
save_marker(j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET *data;
  JLONG length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {          /* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int)M_COM)
        limit = marker->length_limit_COM;
      else
        limit = marker->length_limit_APPn[cinfo->unread_marker - (int)M_APP0];
      if ((unsigned int)length < limit)
        limit = (unsigned int)length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
        (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                    sizeof(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8)cinfo->unread_marker;
      cur_marker->original_length = (unsigned int)length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET *)(cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);          /* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {     /* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
        prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
             (int)(data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);            /* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}